

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O2

bool __thiscall trun::TestFunc::IsGlobalExit(TestFunc *this)

{
  bool bVar1;
  __type _Var2;
  Config *pCVar3;
  
  bVar1 = IsGlobal(this);
  if (bVar1) {
    pCVar3 = Config::Instance();
    _Var2 = std::operator==(&this->caseName,&pCVar3->exitFuncName);
    return _Var2;
  }
  return false;
}

Assistant:

bool TestFunc::IsGlobalExit() {
    return (IsGlobal() && (caseName == Config::Instance().exitFuncName));
}